

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_todo.cpp
# Opt level: O0

void __thiscall Am_Window_ToDo::Add(Am_Window_ToDo *this)

{
  Am_Window_ToDo *pAVar1;
  Am_Window_ToDo *pAVar2;
  Am_Window_ToDo *this_local;
  
  pAVar1 = Window_ToDo_Head;
  pAVar2 = Window_ToDo_Tail;
  if ((((this->prev == (Am_Window_ToDo *)0x0) && (this->next == (Am_Window_ToDo *)0x0)) &&
      (Window_ToDo_Head != this)) &&
     (this->prev = Window_ToDo_Tail, pAVar1 = this, pAVar2 = this,
     Window_ToDo_Tail != (Am_Window_ToDo *)0x0)) {
    Window_ToDo_Tail->next = this;
    pAVar1 = Window_ToDo_Head;
    pAVar2 = this;
  }
  Window_ToDo_Tail = pAVar2;
  Window_ToDo_Head = pAVar1;
  return;
}

Assistant:

void
Am_Window_ToDo::Add()
{
  if (!prev && !next && (Window_ToDo_Head != this)) {
    prev = Window_ToDo_Tail;
    if (Window_ToDo_Tail)
      Window_ToDo_Tail->next = this;
    else
      Window_ToDo_Head = this;
    Window_ToDo_Tail = this;
  }
}